

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_logging.cc
# Opt level: O0

bool absl::raw_logging_internal::anon_unknown_0::VADoRawLog
               (char **buf,int *size,char *format,__va_list_tag *ap)

{
  bool local_2d;
  int local_2c;
  bool result;
  int n;
  __va_list_tag *ap_local;
  char *format_local;
  int *size_local;
  char **buf_local;
  
  local_2c = vsnprintf(*buf,(long)*size,format,ap);
  local_2d = true;
  if ((local_2c < 0) || (*size < local_2c)) {
    local_2d = false;
    if ((uint)*size < 0x1b) {
      local_2c = 0;
    }
    else {
      local_2c = *size + -0x1a;
    }
  }
  *size = *size - local_2c;
  *buf = *buf + local_2c;
  return local_2d;
}

Assistant:

bool VADoRawLog(char** buf, int* size, const char* format, va_list ap) {
  int n = vsnprintf(*buf, *size, format, ap);
  bool result = true;
  if (n < 0 || n > *size) {
    result = false;
    if (static_cast<size_t>(*size) > sizeof(kTruncated)) {
      n = *size - sizeof(kTruncated);  // room for truncation message
    } else {
      n = 0;  // no room for truncation message
    }
  }
  *size -= n;
  *buf += n;
  return result;
}